

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O3

err_t Read(stdio_stream *p,void *Data,size_t Size,size_t *Readed)

{
  size_t sVar1;
  err_t eVar2;
  
  sVar1 = fread(Data,1,Size,(FILE *)p->Stream);
  if (Readed != (size_t *)0x0) {
    *Readed = sVar1;
  }
  eVar2 = -10;
  if (sVar1 == Size) {
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static err_t Read(filestream* p,void* Data,size_t Size,size_t* Readed)
{
    if (Size > SSIZE_MAX)
        return ERR_READ;
    err_t Err;
    ssize_t n = read(p->fd, Data, Size);
    if (n<0)
    {
        n=0;
        Err = ERR_READ;
    }
    else
        Err = (n != (ssize_t)Size) ? ERR_END_OF_FILE:ERR_NONE;

    if (Readed)
        *Readed = n;
    return Err;
}